

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O0

node_type * __thiscall
st_tree::detail::
node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>::
_copy_data(node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
           *this,tree_type *tree_)

{
  bool bVar1;
  vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
  *this_00;
  reference ppnVar2;
  node_type *local_38;
  __normal_iterator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*const_*,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
  local_30;
  __normal_iterator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*const_*,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
  local_28;
  cs_const_iterator j;
  node_type *n;
  tree_type *tree__local;
  node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
  *this_local;
  
  j._M_current = (node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
                  **)tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>::_new_node
                               (tree_);
  ut_raw::emplace_subnodes::test_method::str1::operator=
            (&(((node_type *)j._M_current)->
              super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
              )._data,&(this->
                       super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                       )._data);
  max_maintainer<unsigned_long,_std::allocator<str1>_>::operator=
            ((max_maintainer<unsigned_long,_std::allocator<str1>_> *)(j._M_current + 0xc),
             &(this->
              super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
              )._depth);
  local_28._M_current =
       (node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
        **)std::
           vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
           ::begin(&(this->
                    super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                    )._children);
  while( true ) {
    local_30._M_current =
         (node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>
          **)std::
             vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
             ::end(&(this->
                    super_node_base<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
                    )._children);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this_00 = (vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
               *)(j._M_current + 9);
    ppnVar2 = __gnu_cxx::
              __normal_iterator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*const_*,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
              ::operator*(&local_28);
    local_38 = _copy_data(*ppnVar2,tree_);
    std::
    vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>
    ::push_back(this_00,&local_38);
    __gnu_cxx::
    __normal_iterator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*const_*,_std::vector<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<str1,_st_tree::raw<st_tree::arg_unused>,_std::allocator<str1>_>,_str1>_*>_>_>
    ::operator++(&local_28);
  }
  return (node_type *)j._M_current;
}

Assistant:

node_type* _copy_data(tree_type& tree_) const {
        node_type* n = tree_._new_node();
        n->_data = this->_data;
        n->_depth = this->_depth;
        for (cs_const_iterator j(this->_children.begin()); j != this->_children.end(); ++j)
            n->_children.push_back((*j)->_copy_data(tree_));
        return n;
    }